

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O1

string * __thiscall
t_xml_generator::number_to_string<double>
          (string *__return_storage_ptr__,t_xml_generator *this,double t)

{
  ostringstream out;
  locale local_190 [8];
  long local_188;
  undefined8 local_180 [13];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  std::locale::classic();
  std::ios::imbue(local_190);
  std::locale::~locale(local_190);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 0xf;
  std::ostream::_M_insert<double>(t);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

string number_to_string(T t) {
    std::ostringstream out;
    out.imbue(std::locale::classic());
    out.precision(std::numeric_limits<T>::digits10);
    out << t;
    return out.str();
  }